

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_write_set_format_iso9660.c
# Opt level: O0

int get_str_opt(archive_write *a,archive_string *s,size_t maxsize,char *key,char *value)

{
  archive_string *paVar1;
  void *in_RCX;
  archive_string *in_RDX;
  long in_RSI;
  archive *in_RDI;
  char *in_R8;
  int local_4;
  
  paVar1 = (archive_string *)strlen(in_R8);
  if (in_RDX < paVar1) {
    archive_set_error(in_RDI,-1,"Value is longer than %zu characters for option ``%s\'\'",in_RDX,
                      in_RCX);
    local_4 = -0x1e;
  }
  else {
    *(undefined8 *)(in_RSI + 8) = 0;
    if (in_R8 != (char *)0x0) {
      strlen(in_R8);
    }
    archive_strncat(in_RDX,in_RCX,(size_t)in_R8);
    local_4 = 0;
  }
  return local_4;
}

Assistant:

static int
get_str_opt(struct archive_write *a, struct archive_string *s,
    size_t maxsize, const char *key, const char *value)
{

	if (strlen(value) > maxsize) {
		archive_set_error(&a->archive, ARCHIVE_ERRNO_MISC,
		    "Value is longer than %zu characters "
		    "for option ``%s''", maxsize, key);
		return (ARCHIVE_FATAL);
	}
	archive_strcpy(s, value);
	return (ARCHIVE_OK);
}